

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O2

void Amap_RemoveComments(char *pBuffer,int *pnDots,int *pnLines)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = 0;
  do {
    cVar2 = *pBuffer;
    if (cVar2 == '\n') {
LAB_003a419f:
      if (pBuffer[-1] == '\\') {
        pBuffer[-1] = ' ';
        pBuffer[0] = ' ';
      }
      else if ((pBuffer[-1] == '\r') && (pBuffer[-2] == '\\')) {
        pBuffer[-2] = ' ';
        pBuffer[-1] = ' ';
        *pBuffer = ' ';
      }
      else {
        iVar3 = iVar3 + 1;
      }
    }
    else {
      if (cVar2 == '#') {
        while (cVar2 != '\n') {
          *pBuffer = ' ';
          pcVar1 = pBuffer + 1;
          pBuffer = pBuffer + 1;
          cVar2 = *pcVar1;
        }
        goto LAB_003a419f;
      }
      if (cVar2 == '.') {
        iVar4 = iVar4 + 1;
      }
      else if (cVar2 == '\0') {
        if (pnDots != (int *)0x0) {
          *pnDots = iVar4;
        }
        if (pnLines != (int *)0x0) {
          *pnLines = iVar3;
        }
        return;
      }
    }
    pBuffer = pBuffer + 1;
  } while( true );
}

Assistant:

void Amap_RemoveComments( char * pBuffer, int * pnDots, int * pnLines )
{
    char * pCur;
    int nDots, nLines;
    // scan through the buffer and eliminate comments
    // (in the BLIF file, comments are lines starting with "#")
    nDots = nLines = 0;
    for ( pCur = pBuffer; *pCur; pCur++ )
    {
        // if this is the beginning of comment
        // clean it with spaces until the new line statement
        if ( *pCur == '#' )
            while ( *pCur != '\n' )
                *pCur++ = ' ';
    
        // count the number of new lines and dots
        if ( *pCur == '\n' ) {
        if (*(pCur-1)=='\r') {
        // DOS(R) file support
        if (*(pCur-2)!='\\') nLines++;
        else {
            // rewind to backslash and overwrite with a space
            *(pCur-2) = ' ';
            *(pCur-1) = ' ';
            *pCur = ' ';
        }
        } else {
        // UNIX(TM) file support
        if (*(pCur-1)!='\\') nLines++;
        else {
            // rewind to backslash and overwrite with a space
            *(pCur-1) = ' ';
            *pCur = ' ';
        }
        }
    }
        else if ( *pCur == '.' )
            nDots++;
    }
    if ( pnDots )
        *pnDots = nDots; 
    if ( pnLines )
        *pnLines = nLines; 
}